

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLSSetUserData(ARKodeMem ark_mem,void *user_data)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = (*ark_mem->step_getlinmem)(ark_mem);
  if (pvVar1 == (void *)0x0) {
    iVar2 = -2;
    arkProcessError(ark_mem,-2,0xff8,"arkLSSetUserData",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"Linear solver memory is NULL.");
  }
  else {
    if (*(int *)((long)pvVar1 + 8) == 0) {
      *(void **)((long)pvVar1 + 0x18) = user_data;
    }
    if (*(int *)((long)pvVar1 + 0xf0) == 0) {
      *(void **)((long)pvVar1 + 0x110) = user_data;
    }
    if (*(int *)((long)pvVar1 + 0x118) != 0) {
      *(void **)((long)pvVar1 + 0x128) = user_data;
    }
    *(void **)((long)pvVar1 + 0xe8) = user_data;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int arkLSSetUserData(ARKodeMem ark_mem, void* user_data)
{
  ARKLsMem arkls_mem;
  int retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARKLS_SUCCESS) { return (retval); }

  /* Set data for Jacobian */
  if (!arkls_mem->jacDQ) { arkls_mem->J_data = user_data; }

  /* Set data for Jtimes */
  if (!arkls_mem->jtimesDQ) { arkls_mem->Jt_data = user_data; }

  /* Set data for LinSys */
  if (arkls_mem->user_linsys) { arkls_mem->A_data = user_data; }

  /* Set data for Preconditioner */
  arkls_mem->P_data = user_data;

  return (ARKLS_SUCCESS);
}